

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::vector
          (vector<basist::ktx2_transcoder::key_value> *this,
          vector<basist::ktx2_transcoder::key_value> *other)

{
  uint uVar1;
  uchar *puVar2;
  key_value *this_00;
  uint32_t uVar3;
  uint32_t *puVar4;
  
  this->m_p = (key_value *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)this,other->m_size,false,0x20,object_mover,false);
  uVar3 = other->m_size;
  this->m_size = uVar3;
  if (uVar3 != 0) {
    this_00 = this->m_p;
    puVar4 = &(other->m_p->m_value).m_size;
    do {
      (this_00->m_key).m_p = (uchar *)0x0;
      *(undefined8 *)&(this_00->m_key).m_size = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,puVar4[-4],false,1,(object_mover)0x0,false);
      uVar1 = puVar4[-4];
      (this_00->m_key).m_size = uVar1;
      puVar2 = (this_00->m_key).m_p;
      if ((puVar2 != (uchar *)0x0) && (*(void **)(puVar4 + -6) != (void *)0x0)) {
        memcpy(puVar2,*(void **)(puVar4 + -6),(ulong)uVar1);
      }
      (this_00->m_value).m_p = (uchar *)0x0;
      (this_00->m_value).m_size = 0;
      (this_00->m_value).m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&this_00->m_value,*puVar4,false,1,(object_mover)0x0,false);
      uVar1 = *puVar4;
      (this_00->m_value).m_size = uVar1;
      puVar2 = (this_00->m_value).m_p;
      if ((puVar2 != (uchar *)0x0) && (((uint8_vec *)(puVar4 + -2))->m_p != (uchar *)0x0)) {
        memcpy(puVar2,((uint8_vec *)(puVar4 + -2))->m_p,(ulong)uVar1);
      }
      this_00 = this_00 + 1;
      puVar4 = puVar4 + 8;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

inline vector(const vector& other) :
         m_p(NULL),
         m_size(0),
         m_capacity(0)
      {
         increase_capacity(other.m_size, false);

         m_size = other.m_size;

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }
      }